

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_helper.c
# Opt level: O0

target_ulong helper_inb_x86_64(CPUX86State *env,uint32_t port)

{
  byte bVar1;
  uint32_t port_local;
  CPUX86State *env_local;
  
  bVar1 = cpu_inb_x86_64(env->uc,port);
  return (ulong)bVar1;
}

Assistant:

target_ulong helper_inb(CPUX86State *env, uint32_t port)
{
// #ifdef UNICORN_ARCH_POSTFIX
//     return glue(address_space_ldub, UNICORN_ARCH_POSTFIX)(env->uc, &env->uc->address_space_io, port,
// #else
//     return address_space_ldub(env->uc, &env->uc->address_space_io, port,
// #endif
//                               cpu_get_mem_attrs(env), NULL);
    return cpu_inb(env->uc, port);
}